

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O2

bool __thiscall btLemkeAlgorithm::LexicographicPositive(btLemkeAlgorithm *this,btVectorXf *v)

{
  float fVar1;
  int i;
  long lVar2;
  btScalar bVar3;
  
  for (lVar2 = 0; lVar2 < (long)(v->m_storage).m_size + -1; lVar2 = lVar2 + 1) {
    fVar1 = (v->m_storage).m_data[lVar2];
    bVar3 = btMachEps();
    if (bVar3 <= ABS(fVar1)) break;
  }
  return 0.0 < (v->m_storage).m_data[lVar2];
}

Assistant:

bool btLemkeAlgorithm::LexicographicPositive(const btVectorXu & v)
{
    int i = 0;
  //  if (DEBUGLEVEL)
    //  cout << "v " << v << endl;

    while(i < v.size()-1 && fabs(v[i]) < btMachEps())
      i++;
    if (v[i] > 0)
      return true;

    return false;
  }